

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O2

void get_msurf_descriptor_haar_unroll_3_1_False(integral_image *iimage,interest_point *ipoint)

{
  long lVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int i;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  float *pfVar25;
  long lVar26;
  long lVar27;
  float *pfVar28;
  int iVar29;
  float *pfVar30;
  long lVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  undefined1 auVar54 [16];
  float fVar55;
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  undefined1 auVar62 [12];
  undefined1 in_ZMM8 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  undefined1 auVar66 [64];
  
  auVar40._8_4_ = 0x3effffff;
  auVar40._0_8_ = 0x3effffff3effffff;
  auVar40._12_4_ = 0x3effffff;
  auVar39._8_4_ = 0x80000000;
  auVar39._0_8_ = 0x8000000080000000;
  auVar39._12_4_ = 0x80000000;
  fVar47 = ipoint->scale;
  auVar66 = ZEXT464((uint)fVar47);
  auVar41 = ZEXT416((uint)fVar47);
  auVar32 = vpternlogd_avx512vl(auVar40,auVar41,auVar39,0xf8);
  auVar32 = ZEXT416((uint)(fVar47 + auVar32._0_4_));
  auVar32 = vroundss_avx(auVar32,auVar32,0xb);
  fVar44 = -0.08 / (fVar47 * fVar47);
  iVar16 = (int)auVar32._0_4_;
  auVar33._0_4_ = (int)auVar32._0_4_;
  auVar33._4_4_ = (int)auVar32._4_4_;
  auVar33._8_4_ = (int)auVar32._8_4_;
  auVar33._12_4_ = (int)auVar32._12_4_;
  auVar32 = vcvtdq2ps_avx(auVar33);
  auVar33 = vpternlogd_avx512vl(auVar40,ZEXT416((uint)ipoint->x),auVar39,0xf8);
  auVar33 = ZEXT416((uint)(ipoint->x + auVar33._0_4_));
  auVar33 = vroundss_avx(auVar33,auVar33,0xb);
  auVar34._0_8_ = (double)auVar33._0_4_;
  auVar34._8_8_ = auVar33._8_8_;
  auVar38._0_8_ = (double)fVar47;
  auVar38._8_8_ = 0;
  auVar33 = vfmadd231sd_fma(auVar34,auVar38,ZEXT816(0x3fe0000000000000));
  auVar37._0_4_ = (float)auVar33._0_8_;
  auVar37._4_12_ = auVar33._4_12_;
  auVar33 = vpternlogd_avx512vl(auVar40,ZEXT416((uint)ipoint->y),auVar39,0xf8);
  fVar65 = auVar37._0_4_ - auVar32._0_4_;
  auVar33 = ZEXT416((uint)(ipoint->y + auVar33._0_4_));
  auVar33 = vroundss_avx(auVar33,auVar33,0xb);
  auVar35._0_8_ = (double)auVar33._0_4_;
  auVar35._8_8_ = auVar33._8_8_;
  auVar33 = vfmadd231sd_fma(auVar35,auVar38,ZEXT816(0x3fe0000000000000));
  auVar36._0_4_ = (float)auVar33._0_8_;
  auVar36._4_12_ = auVar33._4_12_;
  fVar3 = auVar36._0_4_ - auVar32._0_4_;
  auVar34 = ZEXT416((uint)fVar47);
  auVar32 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar34,auVar37);
  auVar33 = vpternlogd_avx512vl(auVar40,auVar32,auVar39,0xf8);
  auVar32 = ZEXT416((uint)(auVar32._0_4_ + auVar33._0_4_));
  auVar32 = vroundss_avx(auVar32,auVar32,0xb);
  if (iVar16 < (int)auVar32._0_4_) {
    auVar42._8_4_ = 0x3effffff;
    auVar42._0_8_ = 0x3effffff3effffff;
    auVar42._12_4_ = 0x3effffff;
    auVar43._8_4_ = 0x80000000;
    auVar43._0_8_ = 0x8000000080000000;
    auVar43._12_4_ = 0x80000000;
    auVar32 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar34,auVar36);
    auVar33 = vpternlogd_avx512vl(auVar43,auVar32,auVar42,0xea);
    auVar32 = ZEXT416((uint)(auVar32._0_4_ + auVar33._0_4_));
    auVar32 = vroundss_avx(auVar32,auVar32,0xb);
    if (iVar16 < (int)auVar32._0_4_) {
      auVar32 = vfmadd231ss_fma(auVar37,auVar34,ZEXT416(0x41300000));
      auVar59._8_4_ = 0x80000000;
      auVar59._0_8_ = 0x8000000080000000;
      auVar59._12_4_ = 0x80000000;
      auVar33 = vpternlogd_avx512vl(auVar59,auVar32,auVar42,0xea);
      auVar32 = ZEXT416((uint)(auVar32._0_4_ + auVar33._0_4_));
      auVar32 = vroundss_avx(auVar32,auVar32,0xb);
      if ((int)auVar32._0_4_ + iVar16 <= iimage->width) {
        auVar32 = vfmadd231ss_fma(auVar36,auVar34,ZEXT416(0x41300000));
        auVar11._8_4_ = 0x80000000;
        auVar11._0_8_ = 0x8000000080000000;
        auVar11._12_4_ = 0x80000000;
        auVar33 = vpternlogd_avx512vl(auVar42,auVar32,auVar11,0xf8);
        auVar32 = ZEXT416((uint)(auVar32._0_4_ + auVar33._0_4_));
        auVar32 = vroundss_avx(auVar32,auVar32,0xb);
        if ((int)auVar32._0_4_ + iVar16 <= iimage->height) {
          fVar3 = fVar3 + 0.5;
          lVar31 = 0;
          for (iVar17 = -0xc; iVar17 < 0xc; iVar17 = iVar17 + 3) {
            auVar32._0_4_ = (float)iVar17;
            auVar62 = in_ZMM8._4_12_;
            auVar32._4_12_ = auVar62;
            lVar26 = 0;
            auVar34 = auVar66._0_16_;
            auVar32 = vfmadd213ss_fma(auVar32,auVar34,ZEXT416((uint)fVar3));
            auVar50._0_4_ = (float)(iVar17 + 1);
            auVar50._4_12_ = auVar62;
            auVar33 = vfmadd213ss_fma(auVar50,auVar34,ZEXT416((uint)fVar3));
            auVar51._0_4_ = (float)(iVar17 + 2);
            auVar51._4_12_ = auVar62;
            auVar34 = vfmadd213ss_fma(auVar51,auVar34,ZEXT416((uint)fVar3));
            iVar29 = -0xc;
            for (; lVar26 != 0x60; lVar26 = lVar26 + 4) {
              auVar52._0_4_ = (float)iVar29;
              auVar52._4_12_ = in_ZMM8._4_12_;
              auVar35 = vfmadd132ss_fma(auVar52,ZEXT416((uint)(fVar65 + 0.5)),ZEXT416((uint)fVar47))
              ;
              iVar18 = (int)auVar35._0_4_;
              haarXY_unconditional
                        (iimage,(int)auVar32._0_4_,iVar18,iVar16,
                         (float *)((long)haarResponseX + lVar26 + lVar31),
                         (float *)((long)haarResponseY + lVar26 + lVar31));
              haarXY_unconditional
                        (iimage,(int)auVar33._0_4_,iVar18,iVar16,
                         (float *)((long)haarResponseX + lVar26 + 0x60 + lVar31),
                         (float *)((long)haarResponseY + lVar26 + 0x60 + lVar31));
              haarXY_unconditional
                        (iimage,(int)auVar34._0_4_,iVar18,iVar16,
                         (float *)((long)haarResponseX + lVar26 + 0xc0 + lVar31),
                         (float *)((long)haarResponseY + lVar26 + 0xc0 + lVar31));
              iVar29 = iVar29 + 1;
            }
            auVar66 = ZEXT1664(auVar41);
            lVar31 = lVar31 + 0x120;
          }
          goto LAB_00178cf1;
        }
      }
    }
  }
  lVar31 = 0;
  for (iVar17 = -0xc; iVar17 < 0xc; iVar17 = iVar17 + 3) {
    auVar48._0_4_ = (float)iVar17;
    auVar62 = in_ZMM8._4_12_;
    auVar48._4_12_ = auVar62;
    auVar33 = auVar66._0_16_;
    auVar32 = vfmadd213ss_fma(auVar48,auVar33,ZEXT416((uint)fVar3));
    auVar54._0_4_ = (float)(iVar17 + 1);
    auVar54._4_12_ = auVar62;
    fVar45 = auVar32._0_4_;
    auVar57._0_4_ = (float)(iVar17 + 2);
    auVar57._4_12_ = auVar62;
    auVar32 = vfmadd213ss_fma(auVar54,auVar33,ZEXT416((uint)fVar3));
    auVar33 = vfmadd213ss_fma(auVar57,auVar33,ZEXT416((uint)fVar3));
    fVar53 = auVar32._0_4_;
    fVar55 = auVar33._0_4_;
    iVar29 = -0xc;
    for (lVar26 = 0; lVar26 != 0x60; lVar26 = lVar26 + 4) {
      auVar49._0_4_ = (float)iVar29;
      auVar49._4_12_ = in_ZMM8._4_12_;
      auVar32 = vfmadd132ss_fma(auVar49,ZEXT416((uint)fVar65),ZEXT416((uint)fVar47));
      fVar46 = auVar32._0_4_;
      iVar18 = (int)((double)((ulong)(0.0 <= fVar46) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar46) * -0x4020000000000000) + (double)fVar46);
      haarXY_precheck_boundaries
                (iimage,(int)((double)((ulong)(0.0 <= fVar45) * 0x3fe0000000000000 +
                                      (ulong)(0.0 > fVar45) * -0x4020000000000000) + (double)fVar45)
                 ,iVar18,iVar16,(float *)((long)haarResponseX + lVar26 + lVar31),
                 (float *)((long)haarResponseY + lVar26 + lVar31));
      haarXY_precheck_boundaries
                (iimage,(int)((double)((ulong)(0.0 <= fVar53) * 0x3fe0000000000000 +
                                      (ulong)(0.0 > fVar53) * -0x4020000000000000) + (double)fVar53)
                 ,iVar18,iVar16,(float *)((long)haarResponseX + lVar26 + 0x60 + lVar31),
                 (float *)((long)haarResponseY + lVar26 + 0x60 + lVar31));
      haarXY_precheck_boundaries
                (iimage,(int)((double)((ulong)(0.0 <= fVar55) * 0x3fe0000000000000 +
                                      (ulong)(0.0 > fVar55) * -0x4020000000000000) + (double)fVar55)
                 ,iVar18,iVar16,(float *)((long)haarResponseX + lVar26 + 0xc0 + lVar31),
                 (float *)((long)haarResponseY + lVar26 + 0xc0 + lVar31));
      iVar29 = iVar29 + 1;
    }
    auVar66 = ZEXT1664(auVar41);
    lVar31 = lVar31 + 0x120;
  }
LAB_00178cf1:
  fVar65 = auVar66._0_4_;
  auVar64._8_4_ = 0x3effffff;
  auVar64._0_8_ = 0x3effffff3effffff;
  auVar64._12_4_ = 0x3effffff;
  auVar63._8_4_ = 0x80000000;
  auVar63._0_8_ = 0x8000000080000000;
  auVar63._12_4_ = 0x80000000;
  auVar32 = vpternlogd_avx512vl(auVar64,ZEXT416((uint)(fVar65 * 0.5)),auVar63,0xf8);
  auVar32 = ZEXT416((uint)(fVar65 * 0.5 + auVar32._0_4_));
  auVar32 = vroundss_avx(auVar32,auVar32,0xb);
  auVar33 = vpternlogd_avx512vl(auVar64,ZEXT416((uint)(fVar65 * 1.5)),auVar63,0xf8);
  auVar33 = ZEXT416((uint)(fVar65 * 1.5 + auVar33._0_4_));
  auVar33 = vroundss_avx(auVar33,auVar33,0xb);
  auVar34 = vpternlogd_avx512vl(auVar64,ZEXT416((uint)(fVar65 * 2.5)),auVar63,0xf8);
  auVar34 = ZEXT416((uint)(fVar65 * 2.5 + auVar34._0_4_));
  auVar34 = vroundss_avx(auVar34,auVar34,0xb);
  auVar35 = vpternlogd_avx512vl(auVar64,ZEXT416((uint)(fVar65 * 3.5)),auVar63,0xf8);
  auVar35 = ZEXT416((uint)(fVar65 * 3.5 + auVar35._0_4_));
  auVar35 = vroundss_avx(auVar35,auVar35,0xb);
  auVar36 = vpternlogd_avx512vl(auVar64,ZEXT416((uint)(fVar65 * 4.5)),auVar63,0xf8);
  auVar36 = ZEXT416((uint)(fVar65 * 4.5 + auVar36._0_4_));
  auVar36 = vroundss_avx(auVar36,auVar36,0xb);
  auVar37 = vpternlogd_avx512vl(auVar64,ZEXT416((uint)(fVar65 * 5.5)),auVar63,0xf8);
  auVar37 = ZEXT416((uint)(fVar65 * 5.5 + auVar37._0_4_));
  auVar37 = vroundss_avx(auVar37,auVar37,0xb);
  auVar38 = vpternlogd_avx512vl(auVar64,ZEXT416((uint)(fVar65 * 6.5)),auVar63,0xf8);
  auVar38 = ZEXT416((uint)(fVar65 * 6.5 + auVar38._0_4_));
  auVar38 = vroundss_avx(auVar38,auVar38,0xb);
  auVar39 = vpternlogd_avx512vl(auVar64,ZEXT416((uint)(fVar65 * 7.5)),auVar63,0xf8);
  auVar39 = ZEXT416((uint)(auVar39._0_4_ + fVar65 * 7.5));
  auVar39 = vroundss_avx(auVar39,auVar39,0xb);
  auVar40 = vpternlogd_avx512vl(auVar64,ZEXT416((uint)(fVar65 * 8.5)),auVar63,0xf8);
  auVar40 = ZEXT416((uint)(fVar65 * 8.5 + auVar40._0_4_));
  auVar40 = vroundss_avx(auVar40,auVar40,0xb);
  auVar41 = vpternlogd_avx512vl(auVar64,ZEXT416((uint)(fVar65 * 9.5)),auVar63,0xf8);
  auVar41 = ZEXT416((uint)(fVar65 * 9.5 + auVar41._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  auVar42 = vpternlogd_avx512vl(auVar64,ZEXT416((uint)(fVar65 * 10.5)),auVar63,0xf8);
  auVar42 = ZEXT416((uint)(fVar65 * 10.5 + auVar42._0_4_));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  auVar43 = vpternlogd_avx512vl(auVar64,ZEXT416((uint)(fVar65 * 11.5)),auVar63,0xf8);
  fVar56 = auVar34._0_4_;
  fVar47 = fVar56 + auVar33._0_4_;
  fVar3 = fVar56 + auVar32._0_4_;
  auVar34 = ZEXT416((uint)(fVar65 * 11.5 + auVar43._0_4_));
  auVar34 = vroundss_avx(auVar34,auVar34,0xb);
  fVar65 = fVar56 - auVar32._0_4_;
  fVar45 = fVar56 - auVar33._0_4_;
  fVar53 = fVar56 - auVar35._0_4_;
  fVar55 = fVar56 - auVar36._0_4_;
  fVar46 = fVar56 - auVar37._0_4_;
  fVar56 = fVar56 - auVar38._0_4_;
  fVar61 = auVar39._0_4_;
  fVar4 = fVar61 - auVar35._0_4_;
  fVar5 = fVar61 - auVar36._0_4_;
  fVar6 = fVar61 - auVar37._0_4_;
  fVar7 = fVar61 - auVar38._0_4_;
  fVar8 = fVar61 - auVar40._0_4_;
  fVar9 = fVar61 - auVar41._0_4_;
  fVar10 = fVar61 - auVar42._0_4_;
  fVar61 = fVar61 - auVar34._0_4_;
  gauss_s1_c0[0] = expf(fVar47 * fVar47 * fVar44);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar44);
  gauss_s1_c0[2] = expf(fVar65 * fVar65 * fVar44);
  gauss_s1_c0[3] = expf(fVar45 * fVar45 * fVar44);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar53 * fVar53 * fVar44);
  gauss_s1_c0[6] = expf(fVar55 * fVar55 * fVar44);
  gauss_s1_c0[7] = expf(fVar46 * fVar46 * fVar44);
  gauss_s1_c0[8] = expf(fVar56 * fVar56 * fVar44);
  gauss_s1_c1[0] = expf(fVar4 * fVar4 * fVar44);
  gauss_s1_c1[1] = expf(fVar5 * fVar5 * fVar44);
  gauss_s1_c1[2] = expf(fVar6 * fVar6 * fVar44);
  gauss_s1_c1[3] = expf(fVar7 * fVar7 * fVar44);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar8 * fVar8 * fVar44);
  gauss_s1_c1[6] = expf(fVar9 * fVar9 * fVar44);
  gauss_s1_c1[7] = expf(fVar10 * fVar10 * fVar44);
  gauss_s1_c1[8] = expf(fVar61 * fVar61 * fVar44);
  auVar66 = ZEXT1264(ZEXT812(0));
  lVar31 = 0;
  auVar41._8_4_ = 0x7fffffff;
  auVar41._0_8_ = 0x7fffffff7fffffff;
  auVar41._12_4_ = 0x7fffffff;
  iVar16 = 0;
  lVar26 = 0;
  uVar15 = 0xfffffffffffffff8;
  while (uVar13 = (uint)uVar15, (int)uVar13 < 8) {
    pfVar28 = gauss_s1_c1;
    if (uVar13 != 7) {
      pfVar28 = gauss_s1_c0;
    }
    lVar27 = (long)iVar16;
    lVar26 = (long)(int)lVar26;
    iVar16 = iVar16 + 4;
    if (uVar13 == 0xfffffff8) {
      pfVar28 = gauss_s1_c1;
    }
    uVar19 = 0;
    uVar24 = 0xfffffffffffffff8;
    lVar20 = lVar31;
    while (lVar27 != iVar16) {
      pfVar30 = gauss_s1_c1;
      iVar17 = (int)uVar24;
      if (iVar17 != 7) {
        pfVar30 = gauss_s1_c0;
      }
      auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar24 = (ulong)((uint)(uVar24 >> 0x1c) & 8);
      if (iVar17 == -8) {
        pfVar30 = gauss_s1_c1;
      }
      lVar21 = (long)haarResponseX + lVar20;
      lVar22 = (long)haarResponseY + lVar20;
      for (uVar14 = uVar19; uVar14 < iVar17 * 0x18 + 0x198; uVar14 = uVar14 + 0x18) {
        lVar23 = 0;
        pfVar25 = (float *)((long)pfVar28 + (ulong)(((uint)(uVar15 >> 0x1f) & 1) << 5));
        while (lVar23 != 9) {
          fVar47 = *pfVar25;
          pfVar25 = pfVar25 + (ulong)(~uVar13 >> 0x1f) * 2 + -1;
          lVar1 = lVar23 * 4;
          lVar2 = lVar23 * 4;
          lVar23 = lVar23 + 1;
          auVar34 = ZEXT416((uint)(pfVar30[uVar24] * fVar47 * *(float *)(lVar21 + lVar2)));
          auVar32 = vandps_avx(auVar34,auVar41);
          auVar35 = ZEXT416((uint)(pfVar30[uVar24] * fVar47 * *(float *)(lVar22 + lVar1)));
          auVar33 = vandps_avx(auVar35,auVar41);
          auVar34 = vinsertps_avx(auVar35,auVar34,0x10);
          auVar33 = vmovlhps_avx(auVar34,auVar33);
          auVar32 = vinsertps_avx(auVar33,auVar32,0x30);
          auVar58 = ZEXT1664(CONCAT412(auVar58._12_4_ + auVar32._12_4_,
                                       CONCAT48(auVar58._8_4_ + auVar32._8_4_,
                                                CONCAT44(auVar58._4_4_ + auVar32._4_4_,
                                                         auVar58._0_4_ + auVar32._0_4_))));
        }
        uVar24 = uVar24 + (ulong)(-1 < iVar17) * 2 + -1;
        lVar21 = lVar21 + 0x60;
        lVar22 = lVar22 + 0x60;
      }
      uVar24 = (ulong)(iVar17 + 5);
      uVar19 = uVar19 + 0x78;
      lVar20 = lVar20 + 0x1e0;
      fVar47 = gauss_s2_arr[lVar27];
      auVar12._4_4_ = fVar47;
      auVar12._0_4_ = fVar47;
      auVar12._8_4_ = fVar47;
      auVar12._12_4_ = fVar47;
      auVar35 = vmulps_avx512vl(auVar58._0_16_,auVar12);
      lVar27 = lVar27 + 1;
      auVar60._0_4_ = auVar35._0_4_ * auVar35._0_4_;
      auVar60._4_4_ = auVar35._4_4_ * auVar35._4_4_;
      auVar60._8_4_ = auVar35._8_4_ * auVar35._8_4_;
      auVar60._12_4_ = auVar35._12_4_ * auVar35._12_4_;
      auVar33 = vshufpd_avx(auVar35,auVar35,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar26) = auVar35;
      lVar26 = lVar26 + 4;
      auVar32 = vmovshdup_avx(auVar60);
      auVar34 = vfmadd231ss_fma(auVar32,auVar35,auVar35);
      auVar32 = vshufps_avx(auVar35,auVar35,0xff);
      auVar33 = vfmadd213ss_fma(auVar33,auVar33,auVar34);
      auVar32 = vfmadd213ss_fma(auVar32,auVar32,auVar33);
      auVar66 = ZEXT464((uint)(auVar66._0_4_ + auVar32._0_4_));
    }
    lVar31 = lVar31 + 0x14;
    uVar15 = (ulong)(uVar13 + 5);
  }
  if (auVar66._0_4_ < 0.0) {
    fVar47 = sqrtf(auVar66._0_4_);
  }
  else {
    auVar32 = vsqrtss_avx(auVar66._0_16_,auVar66._0_16_);
    fVar47 = auVar32._0_4_;
  }
  for (lVar31 = 0; lVar31 != 0x40; lVar31 = lVar31 + 1) {
    ipoint->descriptor[lVar31] = (1.0 / fVar47) * ipoint->descriptor[lVar31];
  }
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_3_1_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=3, l_count+=3) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            float ipoint_y_sub_int_scale_add_l2_mul_scale = ipoint_y_sub_int_scale + l2 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_l2_mul_scale + (ipoint_y_sub_int_scale_add_l2_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=1, k_count+=1) {
                int k0 = k + 0;
                int k_count0 = k_count + 0;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=3, l_count+=3) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_05 + l2 * scale);

            for (int k=-12, k_count=0; k<12; k+=1, k_count+=1) {
                int k0 = k + 0;
                int k_count0 = k_count + 0;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}